

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalReference.cpp
# Opt level: O2

HierarchicalReference * __thiscall
slang::ast::HierarchicalReference::join
          (HierarchicalReference *this,Compilation *compilation,HierarchicalReference *other)

{
  int iVar1;
  undefined4 extraout_var;
  HierarchicalReference *pHVar2;
  EVP_PKEY_CTX *src;
  HierarchicalReference *args;
  SmallVector<slang::ast::HierarchicalReference::Element,_2UL> newPath;
  span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> local_98;
  HierarchicalReference local_88;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> local_60;
  
  local_88.path._M_ptr = (pointer)0x0;
  local_88.path._M_extent._M_extent_value = 0;
  local_88.target = other->target;
  local_88.expr = other->expr;
  local_88.upwardCount = this->upwardCount;
  local_98._M_ptr = (other->path)._M_ptr;
  local_98._M_extent._M_extent_value = (other->path)._M_extent._M_extent_value;
  if (((other->path)._M_extent._M_extent_value != 0) &&
     (((((other->path)._M_ptr)->symbol).ptr)->kind == InterfacePort)) {
    local_98._M_ptr = local_98._M_ptr + 1;
    local_98._M_extent._M_extent_value = local_98._M_extent._M_extent_value - 1;
  }
  local_60.data_ = (pointer)local_60.firstElement;
  local_60.len = 0;
  local_60.cap = 2;
  SmallVectorBase<slang::ast::HierarchicalReference::Element>::
  append_range<std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
            (&local_60,&this->path);
  SmallVectorBase<slang::ast::HierarchicalReference::Element>::
  append_range<std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
            (&local_60,&local_98);
  iVar1 = SmallVectorBase<slang::ast::HierarchicalReference::Element>::copy
                    (&local_60,(EVP_PKEY_CTX *)compilation,src);
  local_88.path._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  args = &local_88;
  pHVar2 = BumpAllocator::
           emplace<slang::ast::HierarchicalReference,slang::ast::HierarchicalReference&>
                     (&compilation->super_BumpAllocator,args);
  SmallVectorBase<slang::ast::HierarchicalReference::Element>::cleanup
            (&local_60,(EVP_PKEY_CTX *)args);
  return pHVar2;
}

Assistant:

const HierarchicalReference& HierarchicalReference::join(Compilation& compilation,
                                                         const HierarchicalReference& other) const {
    HierarchicalReference result;
    result.target = other.target;
    result.expr = other.expr;
    result.upwardCount = upwardCount;

    auto otherPath = other.path;
    if (other.isViaIfacePort())
        otherPath = otherPath.subspan(1);

    SmallVector<Element> newPath;
    newPath.append_range(path);
    newPath.append_range(otherPath);
    result.path = newPath.copy(compilation);

    return *compilation.emplace<HierarchicalReference>(result);
}